

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O2

void __thiscall perfetto::base::UnixSocketRaw::SetBlocking(UnixSocketRaw *this,bool is_blocking)

{
  code *pcVar1;
  uint uVar2;
  int iVar3;
  char *fname;
  uint *puVar4;
  char *pcVar5;
  
  uVar2 = fcntl((this->fd_).t_,3,0);
  iVar3 = fcntl((this->fd_).t_,4,(ulong)((uint)!is_blocking << 0xb | uVar2 & 0xfffff7ff));
  if (iVar3 == 0) {
    return;
  }
  fname = Basename(
                  "/workspace/llm4binary/github/license_c_cmakelists/kokkos[P]kokkos-tools/profiling/perfetto-connector/perfetto/perfetto.cc"
                  );
  puVar4 = (uint *)__errno_location();
  uVar2 = *puVar4;
  pcVar5 = strerror(uVar2);
  LogMessage(kLogError,fname,0x10787,"%s (errno: %d, %s)","PERFETTO_CHECK(fcntl_res == 0)",
             (ulong)uVar2,pcVar5);
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

void UnixSocketRaw::SetBlocking(bool is_blocking) {
  PERFETTO_DCHECK(fd_);
#if PERFETTO_BUILDFLAG(PERFETTO_OS_WIN)
  unsigned long flag = is_blocking ? 0 : 1;  // FIONBIO has reverse logic.
  if (is_blocking) {
    // When switching between non-blocking -> blocking mode, we need to reset
    // the event handle registration, otherwise the call will fail.
    PERFETTO_CHECK(WSAEventSelect(*fd_, *event_handle_, 0) == 0);
  }
  PERFETTO_CHECK(ioctlsocket(*fd_, static_cast<long>(FIONBIO), &flag) == 0);
  if (!is_blocking) {
    PERFETTO_CHECK(
        WSAEventSelect(*fd_, *event_handle_,
                       FD_ACCEPT | FD_CONNECT | FD_READ | FD_CLOSE) == 0);
  }
#else
  int flags = fcntl(*fd_, F_GETFL, 0);
  if (!is_blocking) {
    flags |= O_NONBLOCK;
  } else {
    flags &= ~static_cast<int>(O_NONBLOCK);
  }
  int fcntl_res = fcntl(*fd_, F_SETFL, flags);
  PERFETTO_CHECK(fcntl_res == 0);
#endif
}